

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartInputFile.cpp
# Opt level: O0

InputPartData * __thiscall Imf_3_4::MultiPartInputFile::getPart(MultiPartInputFile *this,int n)

{
  element_type *peVar1;
  size_type sVar2;
  ostream *poVar3;
  ArgExc *this_00;
  reference pvVar4;
  int in_ESI;
  stringstream _iex_throw_s;
  stringstream local_198 [16];
  ostream local_188 [380];
  int local_c;
  
  local_c = in_ESI;
  if (-1 < in_ESI) {
    peVar1 = std::
             __shared_ptr_access<Imf_3_4::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Imf_3_4::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2080b8);
    sVar2 = std::
            vector<Imf_3_4::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_4::MultiPartInputFile::Data::Part>_>
            ::size(&peVar1->parts);
    if ((ulong)(long)in_ESI < sVar2) {
      peVar1 = std::
               __shared_ptr_access<Imf_3_4::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Imf_3_4::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2081ec);
      pvVar4 = std::
               vector<Imf_3_4::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_4::MultiPartInputFile::Data::Part>_>
               ::operator[](&peVar1->parts,(long)local_c);
      return &pvVar4->data;
    }
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_198);
  poVar3 = std::operator<<(local_188,"MultiPartInputFile::getPart called with invalid part ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_c);
  poVar3 = std::operator<<(poVar3," on file with ");
  peVar1 = std::
           __shared_ptr_access<Imf_3_4::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Imf_3_4::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x20813c);
  sVar2 = std::
          vector<Imf_3_4::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_4::MultiPartInputFile::Data::Part>_>
          ::size(&peVar1->parts);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar2);
  std::operator<<(poVar3," parts");
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,local_198);
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

InputPartData*
MultiPartInputFile::getPart (int n) const
{
    if (n < 0 || static_cast<size_t> (n) >= _data->parts.size ())
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "MultiPartInputFile::getPart called with invalid part "
                << n << " on file with " << _data->parts.size () << " parts");
    }
    return &(_data->parts[n].data);
}